

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_array(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  undefined1 *puVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 *puVar9;
  void *__s1;
  void *__s2;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  undefined1 *puVar13;
  void *unaff_R14;
  ulong unaff_R15;
  bson_t compare;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_1080 [4];
  uint uStack_107c;
  undefined1 auStack_1000 [4];
  uint uStack_ffc;
  undefined1 auStack_f80 [200];
  undefined1 auStack_eb8 [648];
  undefined1 *puStack_c30;
  undefined1 *puStack_c28;
  undefined1 *puStack_c20;
  void *pvStack_c18;
  ulong uStack_c10;
  code *pcStack_c08;
  undefined1 auStack_c00 [4];
  uint uStack_bfc;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_ab8 [648];
  undefined1 *puStack_830;
  undefined1 *puStack_828;
  undefined1 *puStack_820;
  void *pvStack_818;
  ulong uStack_810;
  code *pcStack_808;
  undefined1 auStack_800 [4];
  uint uStack_7fc;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  undefined1 *puStack_430;
  undefined1 *puStack_428;
  undefined1 *puStack_420;
  void *pvStack_418;
  ulong uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [4];
  uint local_3fc;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  puVar5 = auStack_400;
  puVar13 = auStack_400;
  pcStack_408 = (code *)0x12eb91;
  bson_init(auStack_400);
  pcStack_408 = (code *)0x12eba7;
  bson_append_int32(auStack_400,"0",1,0);
  pcStack_408 = (code *)0x12ebc0;
  bson_append_int32(auStack_400,"1",1,1);
  pcStack_408 = (code *)0x12ebd9;
  bson_append_int32(auStack_400,"2",1,2);
  pcStack_408 = (code *)0x12ebf2;
  bson_append_int32(auStack_400,"3",1,3);
  pcStack_408 = (code *)0x12ec15;
  cVar1 = bson_init_from_json(local_380,"[ 0, 1, 2, 3 ]",0xffffffffffffffff,local_2b8);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x12ec2d;
    unaff_R14 = (void *)bson_get_data(local_380);
    pcStack_408 = (code *)0x12ec3b;
    puVar5 = (undefined1 *)bson_get_data(auStack_400);
    if (local_3fc == local_37c) {
      pcStack_408 = (code *)0x12ec54;
      pvVar6 = (void *)bson_get_data(auStack_400);
      pcStack_408 = (code *)0x12ec64;
      pvVar7 = (void *)bson_get_data(local_380);
      pcStack_408 = (code *)0x12ec73;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)local_3fc);
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x12ec7f;
        bson_destroy(auStack_400);
        pcStack_408 = (code *)0x12ec8c;
        bson_destroy(local_380);
        return;
      }
    }
    unaff_R12 = local_380;
    pcStack_408 = (code *)0x12ecad;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_408 = (code *)0x12ecbd;
    bson_as_canonical_extended_json(auStack_400,0);
    uVar3 = local_3fc;
    if (local_37c < local_3fc) {
      uVar3 = local_37c;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = local_3fc;
      if (local_37c <= local_3fc) {
        uVar3 = local_37c;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar5[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = local_37c;
    if (local_37c < local_3fc) {
      uVar3 = local_3fc;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_408 = (code *)0x12ed24;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_408 = (code *)0x12ed3c;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_408 = (code *)0x12ed57;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012eda3:
      pcStack_408 = (code *)0x12eda8;
      test_bson_json_array_cold_6();
LAB_0012eda8:
      pcStack_408 = (code *)0x12edad;
      test_bson_json_array_cold_5();
LAB_0012edad:
      pcStack_408 = (code *)0x12edb2;
      test_bson_json_array_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_400;
      if (uVar4 == 0xffffffff) goto LAB_0012eda8;
      puVar13 = (undefined1 *)(ulong)local_37c;
      pcStack_408 = (code *)0x12ed7b;
      puVar9 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar9 != puVar13) goto LAB_0012edad;
      unaff_R14 = (void *)(ulong)local_3fc;
      pcStack_408 = (code *)0x12ed93;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_408 = (code *)0x12eda3;
        test_bson_json_array_cold_4();
        goto LAB_0012eda3;
      }
    }
    pcStack_408 = (code *)0x12edb7;
    test_bson_json_array_cold_3();
    unaff_R13 = puVar13;
  }
  pcStack_408 = test_bson_json_array_single;
  test_bson_json_array_cold_1();
  puVar9 = auStack_800;
  puVar13 = auStack_800;
  pcStack_808 = (code *)0x12ede7;
  puStack_430 = puVar5;
  puStack_428 = unaff_R12;
  puStack_420 = unaff_R13;
  pvStack_418 = unaff_R14;
  uStack_410 = unaff_R15;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_800);
  pcStack_808 = (code *)0x12edfd;
  bson_append_int32(auStack_800,"0",1,0);
  pcStack_808 = (code *)0x12ee20;
  cVar1 = bson_init_from_json(auStack_780,"[ 0 ]",0xffffffffffffffff,auStack_6b8);
  if (cVar1 != '\0') {
    pcStack_808 = (code *)0x12ee38;
    unaff_R14 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x12ee46;
    puVar9 = (undefined1 *)bson_get_data(auStack_800);
    if (uStack_7fc == uStack_77c) {
      pcStack_808 = (code *)0x12ee5f;
      pvVar6 = (void *)bson_get_data(auStack_800);
      pcStack_808 = (code *)0x12ee6f;
      pvVar7 = (void *)bson_get_data(auStack_780);
      pcStack_808 = (code *)0x12ee7e;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_7fc);
      if (iVar2 == 0) {
        pcStack_808 = (code *)0x12ee8a;
        bson_destroy(auStack_800);
        pcStack_808 = (code *)0x12ee97;
        bson_destroy(auStack_780);
        return;
      }
    }
    unaff_R12 = auStack_780;
    pcStack_808 = (code *)0x12eeb8;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_808 = (code *)0x12eec8;
    bson_as_canonical_extended_json(auStack_800,0);
    uVar3 = uStack_7fc;
    if (uStack_77c < uStack_7fc) {
      uVar3 = uStack_77c;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = uStack_7fc;
      if (uStack_77c <= uStack_7fc) {
        uVar3 = uStack_77c;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar9[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = uStack_77c;
    if (uStack_77c < uStack_7fc) {
      uVar3 = uStack_7fc;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_808 = (code *)0x12ef2f;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_808 = (code *)0x12ef47;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_808 = (code *)0x12ef62;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012efae:
      pcStack_808 = (code *)0x12efb3;
      test_bson_json_array_single_cold_6();
LAB_0012efb3:
      pcStack_808 = (code *)0x12efb8;
      test_bson_json_array_single_cold_5();
LAB_0012efb8:
      pcStack_808 = (code *)0x12efbd;
      test_bson_json_array_single_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_800;
      if (uVar4 == 0xffffffff) goto LAB_0012efb3;
      puVar13 = (undefined1 *)(ulong)uStack_77c;
      pcStack_808 = (code *)0x12ef86;
      puVar5 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar5 != puVar13) goto LAB_0012efb8;
      unaff_R14 = (void *)(ulong)uStack_7fc;
      pcStack_808 = (code *)0x12ef9e;
      pvVar6 = (void *)write(uVar4,puVar9,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_808 = (code *)0x12efae;
        test_bson_json_array_single_cold_4();
        goto LAB_0012efae;
      }
    }
    pcStack_808 = (code *)0x12efc2;
    test_bson_json_array_single_cold_3();
    unaff_R13 = puVar13;
  }
  pcStack_808 = test_bson_json_array_int64;
  test_bson_json_array_single_cold_1();
  puVar5 = auStack_c00;
  puVar13 = auStack_c00;
  pcStack_c08 = (code *)0x12eff2;
  puStack_830 = puVar9;
  puStack_828 = unaff_R12;
  puStack_820 = unaff_R13;
  pvStack_818 = unaff_R14;
  uStack_810 = unaff_R15;
  pcStack_808 = (code *)&pcStack_408;
  bson_init(auStack_c00);
  pcStack_c08 = (code *)0x12f00b;
  bson_append_int64(auStack_c00,"0",1,0x7b);
  pcStack_c08 = (code *)0x12f024;
  bson_append_int64(auStack_c00,"1",1,0x2a);
  pcStack_c08 = (code *)0x12f047;
  cVar1 = bson_init_from_json(auStack_b80,
                              "[ { \"$numberLong\" : \"123\" },  { \"$numberLong\" : \"42\" } ]",
                              0xffffffffffffffff,auStack_ab8);
  puStack_c20 = unaff_R13;
  if (cVar1 != '\0') {
    pcStack_c08 = (code *)0x12f05f;
    unaff_R14 = (void *)bson_get_data(auStack_b80);
    pcStack_c08 = (code *)0x12f06d;
    puVar5 = (undefined1 *)bson_get_data(auStack_c00);
    if (uStack_bfc == uStack_b7c) {
      pcStack_c08 = (code *)0x12f086;
      pvVar6 = (void *)bson_get_data(auStack_c00);
      pcStack_c08 = (code *)0x12f096;
      pvVar7 = (void *)bson_get_data(auStack_b80);
      pcStack_c08 = (code *)0x12f0a5;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_bfc);
      if (iVar2 == 0) {
        pcStack_c08 = (code *)0x12f0b1;
        bson_destroy(auStack_c00);
        pcStack_c08 = (code *)0x12f0be;
        bson_destroy(auStack_b80);
        return;
      }
    }
    unaff_R12 = auStack_b80;
    pcStack_c08 = (code *)0x12f0df;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_c08 = (code *)0x12f0ef;
    bson_as_canonical_extended_json(auStack_c00,0);
    uVar3 = uStack_bfc;
    if (uStack_b7c < uStack_bfc) {
      uVar3 = uStack_b7c;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = uStack_bfc;
      if (uStack_b7c <= uStack_bfc) {
        uVar3 = uStack_b7c;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar5[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = uStack_b7c;
    if (uStack_b7c < uStack_bfc) {
      uVar3 = uStack_bfc;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_c08 = (code *)0x12f156;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_c08 = (code *)0x12f16e;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_c08 = (code *)0x12f189;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012f1d5:
      pcStack_c08 = (code *)0x12f1da;
      test_bson_json_array_int64_cold_6();
LAB_0012f1da:
      pcStack_c08 = (code *)0x12f1df;
      test_bson_json_array_int64_cold_5();
LAB_0012f1df:
      pcStack_c08 = (code *)0x12f1e4;
      test_bson_json_array_int64_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_c00;
      if (uVar4 == 0xffffffff) goto LAB_0012f1da;
      puVar13 = (undefined1 *)(ulong)uStack_b7c;
      pcStack_c08 = (code *)0x12f1ad;
      puVar9 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar9 != puVar13) goto LAB_0012f1df;
      unaff_R14 = (void *)(ulong)uStack_bfc;
      pcStack_c08 = (code *)0x12f1c5;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_c08 = (code *)0x12f1d5;
        test_bson_json_array_int64_cold_4();
        goto LAB_0012f1d5;
      }
    }
    pcStack_c08 = (code *)0x12f1e9;
    test_bson_json_array_int64_cold_3();
    puStack_c20 = puVar13;
  }
  pcStack_c08 = test_bson_json_array_subdoc;
  test_bson_json_array_int64_cold_1();
  puStack_c30 = puVar5;
  puStack_c28 = unaff_R12;
  pvStack_c18 = unaff_R14;
  uStack_c10 = unaff_R15;
  pcStack_c08 = (code *)&pcStack_808;
  bson_init(auStack_1080);
  bson_init(auStack_f80);
  bson_append_int32(auStack_f80,"a",1,0x7b);
  bson_append_document(auStack_1080,"0",1,auStack_f80);
  cVar1 = bson_init_from_json(auStack_1000,"[ { \"a\" : 123 } ]",0xffffffffffffffff,auStack_eb8);
  if (cVar1 == '\0') goto LAB_0012f41e;
  pvVar6 = (void *)bson_get_data(auStack_1000);
  pvVar7 = (void *)bson_get_data(auStack_1080);
  if (uStack_107c == uStack_ffc) {
    __s1 = (void *)bson_get_data(auStack_1080);
    __s2 = (void *)bson_get_data(auStack_1000);
    iVar2 = bcmp(__s1,__s2,(ulong)uStack_107c);
    if (iVar2 == 0) {
      bson_destroy(auStack_1080);
      bson_destroy(auStack_1000);
      return;
    }
  }
  uVar8 = bson_as_canonical_extended_json(auStack_1000,0);
  uVar10 = bson_as_canonical_extended_json(auStack_1080,0);
  uVar3 = uStack_107c;
  if (uStack_ffc < uStack_107c) {
    uVar3 = uStack_ffc;
  }
  uVar4 = 0xffffffff;
  if (uVar3 != 0) {
    uVar3 = uStack_107c;
    if (uStack_ffc <= uStack_107c) {
      uVar3 = uStack_ffc;
    }
    lVar12 = 0;
    do {
      if (*(char *)((long)pvVar6 + lVar12) != *(char *)((long)pvVar7 + lVar12)) {
        uVar4 = (uint)lVar12;
        break;
      }
      lVar12 = lVar12 + 1;
    } while (uVar3 != (uint)lVar12);
  }
  uVar3 = uStack_ffc;
  if (uStack_ffc < uStack_107c) {
    uVar3 = uStack_107c;
  }
  uVar3 = uVar3 - 1;
  if (uVar4 != 0xffffffff) {
    uVar3 = uVar4;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8,uVar10);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_0012f40a:
    test_bson_json_array_subdoc_cold_6();
LAB_0012f40f:
    test_bson_json_array_subdoc_cold_5();
LAB_0012f414:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_0012f40f;
    uVar11 = write(iVar2,pvVar6,(ulong)uStack_ffc);
    if (uVar11 != uStack_ffc) goto LAB_0012f414;
    uVar11 = write(__fd,pvVar7,(ulong)uStack_107c);
    if (uVar11 == uStack_107c) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_0012f40a;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_0012f41e:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_array (void)
{
   bson_error_t error;
   const char *json = "[ 0, 1, 2, 3 ]";
   bson_t b, compare;
   bool r;

   bson_init (&compare);
   bson_append_int32 (&compare, "0", 1, 0);
   bson_append_int32 (&compare, "1", 1, 1);
   bson_append_int32 (&compare, "2", 1, 2);
   bson_append_int32 (&compare, "3", 1, 3);

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}